

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O3

void __thiscall icu_63::RuleBasedTimeZone::complete(RuleBasedTimeZone *this,UErrorCode *status)

{
  undefined8 uVar1;
  Replaceable RVar2;
  UBool UVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  int32_t iVar7;
  int32_t iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  UVector *pUVar12;
  void *__s;
  long *plVar13;
  UVector *pUVar14;
  double *obj;
  TimeZoneRule *pTVar15;
  TimeZoneRule *pTVar16;
  undefined8 *buffer;
  void *obj_00;
  TimeZoneRule *pTVar17;
  undefined4 len;
  bool bVar18;
  UErrorCode UVar19;
  size_t s;
  ulong uVar20;
  bool bVar21;
  UDate tt;
  UnicodeString curName;
  UnicodeString name;
  TimeZoneRule *local_100;
  double local_f8;
  double local_e8;
  TimeZoneRule *local_d8;
  double local_c8;
  UVector **local_c0;
  _func_int **local_b8;
  undefined1 local_b0 [64];
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (this->fUpToDate != '\0') {
    return;
  }
  pUVar14 = this->fFinalRules;
  pTVar15 = (TimeZoneRule *)status;
  if (pUVar14 == (UVector *)0x0) {
    pUVar12 = this->fHistoricRules;
    if (pUVar12 == (UVector *)0x0) {
      this->fUpToDate = '\x01';
      return;
    }
    local_100 = &this->fInitialRule->super_TimeZoneRule;
LAB_001f4b86:
    local_c0 = &this->fHistoricRules;
    uVar9 = pUVar12->count;
    s = (size_t)(int)uVar9;
    if ((long)s < 1) {
      __s = (void *)0x0;
      local_f8 = -1.84303902528e+17;
LAB_001f4f43:
      if (pUVar14 == (UVector *)0x0) goto LAB_001f4f48;
      goto LAB_001f4f80;
    }
    __s = uprv_malloc_63(s);
    if (__s == (void *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      deleteTransitions(this);
      goto LAB_001f512d;
    }
    memset(__s,0,s);
    local_f8 = -1.84303902528e+17;
    local_b8 = (_func_int **)&PTR__UnicodeString_003be258;
LAB_001f4be9:
    uVar5 = TimeZoneRule::getRawOffset(local_100);
    uVar6 = TimeZoneRule::getDSTSavings(local_100);
    pTVar15 = (TimeZoneRule *)local_b0;
    local_b0._0_8_ = local_b8;
    local_b0._8_2_ = 2;
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)local_b8;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    TimeZoneRule::getName(local_100,(UnicodeString *)pTVar15);
    uVar20 = 0;
    local_e8 = 1.838821689216e+17;
    local_d8 = (TimeZoneRule *)0x0;
    do {
      if (*(char *)((long)__s + uVar20) == '\0') {
        pTVar16 = (TimeZoneRule *)UVector::elementAt(*local_c0,(int32_t)uVar20);
        pTVar15 = (TimeZoneRule *)(ulong)uVar5;
        iVar10 = (*(pTVar16->super_UObject)._vptr_UObject[9])
                           (local_f8,pTVar16,pTVar15,(ulong)uVar6,0,&local_c8);
        if ((char)iVar10 == '\0') {
          *(undefined1 *)((long)__s + uVar20) = 1;
        }
        else {
          TimeZoneRule::getName(pTVar16,&local_70);
          pTVar15 = local_100;
          iVar10 = (*(pTVar16->super_UObject)._vptr_UObject[4])(pTVar16);
          if ((char)iVar10 == '\0') {
            if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
              len = local_70.fUnion.fFields.fLength;
              if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
                len = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              iVar10 = local_b0._12_4_;
              if (-1 < (short)local_b0._8_2_) {
                iVar10 = (int)(short)local_b0._8_2_ >> 5;
              }
              if ((((int)(short)local_b0._8_2_ & 1U) == 0) && (len == iVar10)) {
                pTVar15 = (TimeZoneRule *)local_b0;
                UVar3 = UnicodeString::doEquals(&local_70,(UnicodeString *)pTVar15,len);
                bVar21 = UVar3 != '\0';
                goto LAB_001f4d1c;
              }
            }
            else {
              bVar21 = (bool)((byte)local_b0._8_2_ & 1);
LAB_001f4d1c:
              if (bVar21 != false) {
                iVar7 = TimeZoneRule::getRawOffset(pTVar16);
                iVar8 = TimeZoneRule::getRawOffset(local_100);
                if (iVar7 == iVar8) {
                  iVar7 = TimeZoneRule::getDSTSavings(pTVar16);
                  iVar8 = TimeZoneRule::getDSTSavings(local_100);
                  if (iVar7 == iVar8) goto LAB_001f4c53;
                }
              }
            }
            if (local_c8 < local_e8) {
              local_e8 = local_c8;
              local_d8 = pTVar16;
            }
          }
        }
      }
LAB_001f4c53:
      uVar20 = uVar20 + 1;
    } while (uVar9 != uVar20);
    if (local_d8 == (TimeZoneRule *)0x0) {
      uVar20 = 0;
      while (*(char *)((long)__s + uVar20) != '\0') {
        uVar20 = uVar20 + 1;
        if (uVar9 == uVar20) goto LAB_001f4eff;
      }
    }
    if (this->fFinalRules != (UVector *)0x0) {
      iVar7 = 0;
      bVar21 = true;
      do {
        bVar18 = bVar21;
        plVar13 = (long *)UVector::elementAt(this->fFinalRules,iVar7);
        pTVar15 = local_100;
        cVar4 = (**(code **)(*plVar13 + 0x20))(plVar13);
        if (cVar4 == '\0') {
          pTVar16 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,iVar7);
          pTVar15 = (TimeZoneRule *)(ulong)uVar5;
          iVar10 = (*(pTVar16->super_UObject)._vptr_UObject[9])
                             (local_f8,pTVar16,pTVar15,(ulong)uVar6,0,&local_c8);
          if (((char)iVar10 != '\0') && (local_c8 < local_e8)) {
            local_e8 = local_c8;
            local_d8 = pTVar16;
          }
        }
        iVar7 = 1;
        bVar21 = false;
      } while (bVar18);
    }
    if (local_d8 == (TimeZoneRule *)0x0) {
LAB_001f4eff:
      UnicodeString::~UnicodeString(&local_70);
      UnicodeString::~UnicodeString((UnicodeString *)local_b0);
      pUVar14 = this->fFinalRules;
      goto LAB_001f4f43;
    }
    if (this->fHistoricTransitions == (UVector *)0x0) {
      pUVar14 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)pTVar15);
      if (pUVar14 != (UVector *)0x0) {
        UVector::UVector(pUVar14,status);
      }
      this->fHistoricTransitions = pUVar14;
      if (U_ZERO_ERROR < *status) goto LAB_001f51e0;
    }
    obj = (double *)uprv_malloc_63(0x18);
    if (obj != (double *)0x0) {
      *obj = local_e8;
      obj[1] = (double)local_100;
      obj[2] = (double)local_d8;
      UVector::addElement(this->fHistoricTransitions,obj,status);
      if (U_ZERO_ERROR < *status) goto LAB_001f51e0;
      UnicodeString::~UnicodeString(&local_70);
      UnicodeString::~UnicodeString((UnicodeString *)local_b0);
      local_f8 = local_e8;
      local_100 = local_d8;
      goto LAB_001f4be9;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
LAB_001f51e0:
    UnicodeString::~UnicodeString(&local_70);
    UnicodeString::~UnicodeString((UnicodeString *)local_b0);
  }
  else {
    if (pUVar14->count != 2) {
      *status = U_INVALID_STATE_ERROR;
      return;
    }
    local_100 = &this->fInitialRule->super_TimeZoneRule;
    pUVar12 = this->fHistoricRules;
    if (pUVar12 != (UVector *)0x0) goto LAB_001f4b86;
    __s = (void *)0x0;
    local_f8 = -1.84303902528e+17;
LAB_001f4f80:
    if (this->fHistoricTransitions == (UVector *)0x0) {
      pUVar14 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)pTVar15);
      if (pUVar14 != (UVector *)0x0) {
        UVector::UVector(pUVar14,status);
      }
      this->fHistoricTransitions = pUVar14;
      if (U_ZERO_ERROR < *status) goto LAB_001f5118;
      pUVar14 = this->fFinalRules;
    }
    pTVar15 = (TimeZoneRule *)UVector::elementAt(pUVar14,0);
    pTVar16 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,1);
    uVar9 = TimeZoneRule::getRawOffset(local_100);
    uVar5 = TimeZoneRule::getDSTSavings(local_100);
    iVar10 = (*(pTVar15->super_UObject)._vptr_UObject[9])
                       (local_f8,pTVar15,(ulong)uVar9,(ulong)uVar5,0,local_b0);
    uVar9 = TimeZoneRule::getRawOffset(local_100);
    uVar5 = TimeZoneRule::getDSTSavings(local_100);
    iVar11 = (*(pTVar16->super_UObject)._vptr_UObject[9])
                       (local_f8,pTVar16,(ulong)uVar9,(ulong)uVar5,0,&local_70);
    UVar19 = U_INVALID_STATE_ERROR;
    if (((char)iVar10 != '\0') && ((char)iVar11 != '\0')) {
      buffer = (undefined8 *)uprv_malloc_63(0x18);
      UVar19 = U_MEMORY_ALLOCATION_ERROR;
      if (buffer != (undefined8 *)0x0) {
        obj_00 = uprv_malloc_63(0x18);
        RVar2.super_UObject._vptr_UObject = (UObject)(UObject)local_70.super_Replaceable;
        uVar1 = local_b0._0_8_;
        if (obj_00 != (void *)0x0) {
          if ((double)local_70.super_Replaceable.super_UObject._vptr_UObject <=
              (double)local_b0._0_8_) {
            *buffer = local_70.super_Replaceable.super_UObject._vptr_UObject;
            buffer[1] = local_100;
            buffer[2] = pTVar16;
            uVar9 = TimeZoneRule::getRawOffset(pTVar16);
            uVar5 = TimeZoneRule::getDSTSavings(pTVar16);
            (*(pTVar15->super_UObject)._vptr_UObject[9])
                      (RVar2.super_UObject._vptr_UObject,pTVar15,(ulong)uVar9,(ulong)uVar5,0,obj_00)
            ;
            pTVar17 = pTVar16;
          }
          else {
            *buffer = local_b0._0_8_;
            buffer[1] = local_100;
            buffer[2] = pTVar15;
            uVar9 = TimeZoneRule::getRawOffset(pTVar15);
            uVar5 = TimeZoneRule::getDSTSavings(pTVar15);
            (*(pTVar16->super_UObject)._vptr_UObject[9])
                      (uVar1,pTVar16,(ulong)uVar9,(ulong)uVar5,0,obj_00);
            pTVar17 = pTVar15;
            pTVar15 = pTVar16;
          }
          *(TimeZoneRule **)((long)obj_00 + 8) = pTVar17;
          *(TimeZoneRule **)((long)obj_00 + 0x10) = pTVar15;
          UVector::addElement(this->fHistoricTransitions,buffer,status);
          if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
             (UVector::addElement(this->fHistoricTransitions,obj_00,status),
             *status < U_ILLEGAL_ARGUMENT_ERROR)) {
LAB_001f4f48:
            this->fUpToDate = '\x01';
            if (__s == (void *)0x0) {
              return;
            }
            uprv_free_63(__s);
            return;
          }
          goto LAB_001f5118;
        }
        uprv_free_63(buffer);
      }
    }
    *status = UVar19;
  }
LAB_001f5118:
  deleteTransitions(this);
  if (__s != (void *)0x0) {
    uprv_free_63(__s);
  }
LAB_001f512d:
  this->fUpToDate = '\0';
  return;
}

Assistant:

TimeZoneRule*
RuleBasedTimeZone::findRuleInFinal(UDate date, UBool local,
                                   int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt) const {
    if (fFinalRules == NULL) {
        return NULL;
    }

    AnnualTimeZoneRule* fr0 = (AnnualTimeZoneRule*)fFinalRules->elementAt(0);
    AnnualTimeZoneRule* fr1 = (AnnualTimeZoneRule*)fFinalRules->elementAt(1);
    if (fr0 == NULL || fr1 == NULL) {
        return NULL;
    }

    UDate start0, start1;
    UDate base;
    int32_t localDelta;

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr1->getRawOffset(), fr1->getDSTSavings(),
                                   fr0->getRawOffset(), fr0->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail0 = fr0->getPreviousStart(base, fr1->getRawOffset(), fr1->getDSTSavings(), TRUE, start0);

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr0->getRawOffset(), fr0->getDSTSavings(),
                                   fr1->getRawOffset(), fr1->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail1 = fr1->getPreviousStart(base, fr0->getRawOffset(), fr0->getDSTSavings(), TRUE, start1);

    if (!avail0 || !avail1) {
        if (avail0) {
            return fr0;
        } else if (avail1) {
            return fr1;
        }
        // Both rules take effect after the given time
        return NULL;
    }

    return (start0 > start1) ? fr0 : fr1;
}